

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

int Prs_ManFindType(char *pName,int *pInputs,int fOut,char ***ppNames)

{
  int iVar1;
  size_t sVar2;
  int local_44;
  int local_34;
  int Length;
  int i;
  char ***ppNames_local;
  int fOut_local;
  int *pInputs_local;
  char *pName_local;
  
  *pInputs = -1;
  local_34 = 1;
  while( true ) {
    if (s_VerInfo[local_34].pTypeName == (char *)0x0) {
      return 3;
    }
    sVar2 = strlen(s_VerInfo[local_34].pTypeName);
    iVar1 = strncmp(pName,s_VerInfo[local_34].pTypeName,(long)(int)sVar2);
    if (iVar1 == 0) break;
    local_34 = local_34 + 1;
  }
  *pInputs = s_VerInfo[local_34].nInputs;
  if (fOut == 0) {
    local_44 = 0;
  }
  else {
    local_44 = s_VerInfo[local_34].nInputs;
  }
  *ppNames = (char **)((long)local_34 * 0x40 + 0xda10e0 + (long)local_44 * 8);
  return s_VerInfo[local_34].Type;
}

Assistant:

static inline int Prs_ManFindType( char * pName, int * pInputs, int fOut, char *** ppNames )
{
    int i, Length;
    *pInputs = -1;
    for ( i = 1; s_VerInfo[i].pTypeName; i++ )
    {
        Length = strlen(s_VerInfo[i].pTypeName);
        if ( !strncmp(pName, s_VerInfo[i].pTypeName, Length) )
        {
            *pInputs = s_VerInfo[i].nInputs;
            *ppNames = (char **)s_VerInfo[i].pSigNames + (fOut ? s_VerInfo[i].nInputs : 0);
            return s_VerInfo[i].Type;
        }
    }
    return CBA_OBJ_BOX;
}